

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O1

int Msat_SolverSimplifyDB(Msat_Solver_t *p)

{
  Msat_ClauseVec_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Msat_Clause_t *pMVar4;
  int *pAssigns;
  Msat_Clause_t **ppMVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int nSizeNew;
  bool bVar9;
  
  iVar1 = Msat_SolverReadDecisionLevel(p);
  if (iVar1 != 0) {
    __assert_fail("Msat_SolverReadDecisionLevel(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                  ,0x122,"int Msat_SolverSimplifyDB(Msat_Solver_t *)");
  }
  pMVar4 = Msat_SolverPropagate(p);
  iVar1 = 0;
  if (pMVar4 == (Msat_Clause_t *)0x0) {
    pAssigns = Msat_SolverReadAssignsArray(p);
    iVar1 = 0;
    iVar7 = 0;
    do {
      p_00 = (&p->vClauses)[iVar7 != 0];
      uVar2 = Msat_ClauseVecReadSize(p_00);
      ppMVar5 = Msat_ClauseVecReadArray(p_00);
      if ((int)uVar2 < 1) {
        nSizeNew = 0;
      }
      else {
        uVar8 = 0;
        nSizeNew = 0;
        do {
          iVar3 = Msat_ClauseSimplify(ppMVar5[uVar8],pAssigns);
          if (iVar3 == 0) {
            lVar6 = (long)nSizeNew;
            nSizeNew = nSizeNew + 1;
            ppMVar5[lVar6] = ppMVar5[uVar8];
            Msat_ClauseSetNum(ppMVar5[uVar8],iVar1);
            iVar1 = iVar1 + 1;
          }
          else {
            Msat_ClauseFree(p,ppMVar5[uVar8],1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      Msat_ClauseVecShrink(p_00,nSizeNew);
      bVar9 = iVar7 == 0;
      iVar7 = iVar7 + 1;
    } while (bVar9);
    p->nClauses = iVar1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int  Msat_SolverSimplifyDB( Msat_Solver_t * p )
{
    Msat_ClauseVec_t * vClauses;
    Msat_Clause_t ** pClauses;
    int nClauses, Type, i, j;
    int * pAssigns;
    int Counter;

    assert( Msat_SolverReadDecisionLevel(p) == 0 );
    if ( Msat_SolverPropagate(p) != NULL )
        return 0;
//Msat_SolverPrintClauses( p );
//Msat_SolverPrintAssignment( p );
//printf( "Simplification\n" );

    // simplify and reassign clause numbers
    Counter = 0;
    pAssigns = Msat_SolverReadAssignsArray( p );
    for ( Type = 0; Type < 2; Type++ )
    {
        vClauses = Type? p->vLearned : p->vClauses;
        nClauses = Msat_ClauseVecReadSize( vClauses );
        pClauses = Msat_ClauseVecReadArray( vClauses );
        for ( i = j = 0; i < nClauses; i++ )
            if ( Msat_ClauseSimplify( pClauses[i], pAssigns ) )
                Msat_ClauseFree( p, pClauses[i], 1 );
            else
            {
                pClauses[j++] = pClauses[i];
                Msat_ClauseSetNum( pClauses[i], Counter++ );
            }
        Msat_ClauseVecShrink( vClauses, j );
    }
    p->nClauses = Counter;
    return 1;
}